

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

int32_t ures_getInt_63(UResourceBundle *resB,UErrorCode *status)

{
  if ((status == (UErrorCode *)0x0) || (U_ZERO_ERROR < *status)) {
    return -1;
  }
  if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if ((resB->fRes & 0xf0000000) == 0x70000000) {
    return (int)(resB->fRes << 4) >> 4;
  }
  *status = U_RESOURCE_TYPE_MISMATCH;
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2 ures_getInt(const UResourceBundle* resB, UErrorCode *status) {
  if (status==NULL || U_FAILURE(*status)) {
    return 0xffffffff;
  }
  if(resB == NULL) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return 0xffffffff;
  }
  if(RES_GET_TYPE(resB->fRes) != URES_INT) {
    *status = U_RESOURCE_TYPE_MISMATCH;
    return 0xffffffff;
  }
  return RES_GET_INT(resB->fRes);
}